

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O3

reference __thiscall
QVLABase<QWidget*>::emplace_back_impl<QWidget*const&>
          (QVLABase<QWidget*> *this,qsizetype prealloc,void *array,QWidget **args)

{
  reference ppQVar1;
  long asize;
  long aalloc;
  
  asize = *(long *)(this + 8);
  if (asize == *(long *)this) {
    aalloc = asize + 1;
    if (asize + 1 < asize * 2) {
      aalloc = asize * 2;
    }
    QVLABase<QWidget_*>::reallocate_impl((QVLABase<QWidget_*> *)this,prealloc,array,asize,aalloc);
    asize = *(long *)(this + 8);
  }
  ppQVar1 = (reference)(*(long *)(this + 0x10) + asize * 8);
  *ppQVar1 = *args;
  *(long *)(this + 8) = asize + 1;
  return ppQVar1;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }